

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall front::syntax::SyntaxAnalyze::gm_block_item(SyntaxAnalyze *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pWVar4;
  
  uVar2 = this->matched_index + 1;
  pWVar4 = (this->word_list->
           super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->word_list->
                 super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pWVar4 >> 4) * -0x5555555555555555;
  if (uVar2 < uVar3) {
    bVar1 = word::Word::match_token(pWVar4 + uVar2,CONSTTK);
    if (bVar1) {
      gm_const_decl(this);
      return;
    }
    pWVar4 = (this->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = this->matched_index + 1;
    uVar3 = ((long)(this->word_list->
                   super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pWVar4 >> 4) *
            -0x5555555555555555;
  }
  if (uVar2 < uVar3) {
    bVar1 = word::Word::match_token(pWVar4 + uVar2,INTTK);
    if (bVar1) {
      gm_var_decl(this);
      return;
    }
  }
  gm_stmt(this);
  return;
}

Assistant:

void SyntaxAnalyze::gm_block_item() {
  if (try_word(1, Token::CONSTTK)) {
    gm_const_decl();
  } else if (try_word(1, Token::INTTK)) {
    gm_var_decl();
  } else {
    gm_stmt();
  }
}